

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Tokeniser.h
# Opt level: O1

bool __thiscall
soul::
Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>::
matchesAny<soul::TokenType,soul::TokenType,soul::TokenType,soul::TokenType,soul::TokenType>
          (Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
           *this,TokenType t1,TokenType others,TokenType others_1,TokenType others_2,
          TokenType others_3)

{
  char *__s1;
  bool bVar1;
  int iVar2;
  
  __s1 = *(char **)(this + 0x28);
  if (__s1 == t1.text) {
    return true;
  }
  if ((t1.text != (char *)0x0 && __s1 != (char *)0x0) && (iVar2 = strcmp(__s1,t1.text), iVar2 == 0))
  {
    return true;
  }
  bVar1 = matchesAny<soul::TokenType,soul::TokenType,soul::TokenType,soul::TokenType>
                    (this,others,others_1,others_2,others_3);
  return bVar1;
}

Assistant:

bool matchesAny (Type1 t1, Args... others) const            { return matches (t1) || matchesAny (others...); }